

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

CURLcode Curl_pp_statemach(Curl_easy *data,pingpong *pp,_Bool block,_Bool disconnecting)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  CURLcode CVar4;
  ulong uVar5;
  uint readfd0;
  ulong timeout_ms;
  uint writefd;
  curltime now;
  
  writefd = data->conn->sock[0];
  uVar5 = Curl_pp_state_timeout(data,pp,disconnecting);
  if ((long)uVar5 < 1) {
    Curl_failf(data,"server response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  timeout_ms = 1000;
  if (uVar5 < 1000) {
    timeout_ms = uVar5;
  }
  if (!block) {
    timeout_ms = 0;
  }
  _Var1 = Curl_conn_data_pending(data,0);
  iVar2 = 1;
  if ((!_Var1) && (pp->overflow == 0)) {
    if (pp->sendleft == 0) {
      _Var1 = Curl_conn_data_pending(data,0);
      if (_Var1) goto LAB_001451e8;
      readfd0 = -(uint)(pp->sendleft != 0) | writefd;
      writefd = writefd | -(uint)(pp->sendleft == 0);
    }
    else {
      readfd0 = 0xffffffff;
    }
    iVar2 = Curl_socket_check(readfd0,-1,writefd,timeout_ms);
  }
LAB_001451e8:
  if (block) {
    iVar3 = Curl_pgrsUpdate(data);
    if (iVar3 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    now = Curl_now();
    CVar4 = Curl_speedcheck(data,now);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
  if (iVar2 == 0) {
    CVar4 = CURLE_OK;
  }
  else {
    if (iVar2 != -1) {
      CVar4 = (*pp->statemachine)(data,data->conn);
      return CVar4;
    }
    Curl_failf(data,"select/poll error");
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_pp_statemach(struct Curl_easy *data,
                           struct pingpong *pp, bool block,
                           bool disconnecting)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int rc;
  timediff_t interval_ms;
  timediff_t timeout_ms = Curl_pp_state_timeout(data, pp, disconnecting);
  CURLcode result = CURLE_OK;

  if(timeout_ms <= 0) {
    failf(data, "server response timeout");
    return CURLE_OPERATION_TIMEDOUT; /* already too little time */
  }

  if(block) {
    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout_ms < interval_ms)
      interval_ms = timeout_ms;
  }
  else
    interval_ms = 0; /* immediate */

  if(Curl_conn_data_pending(data, FIRSTSOCKET))
    rc = 1;
  else if(pp->overflow)
    /* We are receiving and there is data in the cache so just read it */
    rc = 1;
  else if(!pp->sendleft && Curl_conn_data_pending(data, FIRSTSOCKET))
    /* We are receiving and there is data ready in the SSL library */
    rc = 1;
  else
    rc = Curl_socket_check(pp->sendleft ? CURL_SOCKET_BAD : sock, /* reading */
                           CURL_SOCKET_BAD,
                           pp->sendleft ? sock : CURL_SOCKET_BAD, /* writing */
                           interval_ms);

  if(block) {
    /* if we did not wait, we do not have to spend time on this now */
    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());

    if(result)
      return result;
  }

  if(rc == -1) {
    failf(data, "select/poll error");
    result = CURLE_OUT_OF_MEMORY;
  }
  else if(rc)
    result = pp->statemachine(data, data->conn);

  return result;
}